

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O0

ssize_t __thiscall
MTCompositedBupOutputter::write(MTCompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  path *in_stack_ffffffffffffff68;
  path *in_stack_ffffffffffffff90;
  Image *in_stack_ffffffffffffff98;
  ThreadedImageSaver *in_stack_ffffffffffffffa0;
  
  Image::Image((Image *)__buf,(Image *)in_stack_ffffffffffffff68);
  std::filesystem::__cxx11::path::path((path *)__buf,in_stack_ffffffffffffff68);
  ThreadedImageSaver::enqueue
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::filesystem::__cxx11::path::~path((path *)__buf);
  Image::~Image((Image *)0x1278ac);
  return extraout_RAX;
}

Assistant:

void write(Image& img, fs::path path) override {
		writer.enqueue(std::move(img), std::move(path));
	}